

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O0

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalColumnDataScan,duckdb::vector<duckdb::LogicalType,true>&,duckdb::PhysicalOperatorType,unsigned_long&,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>
          (PhysicalPlan *this,vector<duckdb::LogicalType,_true> *args,PhysicalOperatorType *args_1,
          unsigned_long *args_2,
          unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
          *args_3)

{
  PhysicalOperator *this_00;
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  *in_RDI;
  PhysicalColumnDataScan *ptr;
  data_ptr_t mem;
  PhysicalColumnDataScan *in_stack_ffffffffffffff58;
  ArenaAllocator *in_stack_ffffffffffffff60;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  *this_01;
  optionally_owned_ptr<duckdb::ColumnDataCollection> *in_stack_ffffffffffffffa0;
  idx_t in_stack_ffffffffffffffa8;
  PhysicalOperatorType in_stack_ffffffffffffffb7;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffffb8;
  PhysicalColumnDataScan *in_stack_ffffffffffffffc0;
  
  this_00 = (PhysicalOperator *)
            ArenaAllocator::AllocateAligned
                      (in_stack_ffffffffffffff60,(idx_t)in_stack_ffffffffffffff58);
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffff60,
             (vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffff58);
  optionally_owned_ptr<duckdb::ColumnDataCollection>::optionally_owned_ptr
            ((optionally_owned_ptr<duckdb::ColumnDataCollection> *)this_00,in_RDI);
  PhysicalColumnDataScan::PhysicalColumnDataScan
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb7,
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  optionally_owned_ptr<duckdb::ColumnDataCollection>::~optionally_owned_ptr
            ((optionally_owned_ptr<duckdb::ColumnDataCollection> *)0x76ba65);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x76ba6f);
  this_01 = (vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             *)(in_RDI + 9);
  ::std::reference_wrapper<duckdb::PhysicalOperator>::
  reference_wrapper<duckdb::PhysicalColumnDataScan&,void,duckdb::PhysicalOperator*>
            ((reference_wrapper<duckdb::PhysicalOperator> *)this_01,in_stack_ffffffffffffff58);
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ::push_back(this_01,(value_type *)in_stack_ffffffffffffff58);
  return this_00;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}